

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-design.c
# Opt level: O2

void final_check(artifact *art,object *obj)

{
  int iVar1;
  _Bool *p_Var2;
  _Bool *p_Var3;
  activation **ppaVar4;
  bitflag *flags;
  _Bool _Var5;
  bool bVar6;
  short sVar7;
  long lVar8;
  _Bool **pp_Var9;
  effect_object_property *p;
  angband_constants *paVar10;
  int iVar11;
  int16_t *piVar12;
  effect_object_property *peVar13;
  ulong uVar14;
  int *piVar15;
  element_info *el_info;
  element_info *peVar16;
  _Bool **pp_Var17;
  int local_34;
  
  flags = obj->flags;
  piVar12 = obj->modifiers;
  if (art != (artifact *)0x0) {
    piVar12 = art->modifiers;
    flags = art->flags;
  }
  for (uVar14 = 0; uVar14 != 0x11; uVar14 = uVar14 + 1) {
    if (uVar14 < 5) {
      if (piVar12[uVar14] < 0) {
        flag_off(flags,6,(int)uVar14 + 1);
      }
LAB_00187c4e:
      sVar7 = piVar12[uVar14];
      if (5 < sVar7) {
        sVar7 = 6;
      }
      piVar12[uVar14] = sVar7;
    }
    else if (uVar14 != 9) goto LAB_00187c4e;
  }
  peVar16 = art->el_info;
  if (art == (artifact *)0x0) {
    peVar16 = obj->el_info;
  }
  for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
    if (peVar16[lVar8].res_level < 100) {
      peVar16[lVar8].flags = peVar16[lVar8].flags | 2;
    }
  }
  if ((0 < piVar12[5]) && (_Var5 = flag_has_dbg(flags,6,0x1e,"flags","OF_AGGRAVATE"), _Var5)) {
    piVar12[5] = 0;
  }
  if ((0 < piVar12[0xd]) && (_Var5 = flag_has_dbg(flags,6,0x2b,"flags","OF_DARKNESS"), _Var5)) {
    piVar12[0xd] = 0;
  }
  ppaVar4 = &obj->activation;
  pp_Var9 = &obj->brands;
  if (art != (artifact *)0x0) {
    pp_Var9 = &art->brands;
    ppaVar4 = &art->activation;
  }
  pp_Var17 = &obj->slays;
  if (art != (artifact *)0x0) {
    pp_Var17 = &art->slays;
  }
  if (*ppaVar4 != (activation *)0x0) {
    p_Var2 = *pp_Var9;
    p_Var3 = *pp_Var17;
    p = effect_summarize_properties((*ppaVar4)->effect,&local_34);
    if (local_34 < 1) {
      bVar6 = true;
      peVar13 = p;
      while ((peVar13 != (effect_object_property *)0x0 && (bVar6 != false))) {
        bVar6 = false;
        switch(peVar13->kind) {
        case EFPROP_OBJECT_FLAG_EXACT:
        case EFPROP_CURE_FLAG:
        case EFPROP_CONFLICT_FLAG:
          bVar6 = flag_has_dbg(flags,6,peVar13->idx,"flags","pcurr->idx");
          break;
        case EFPROP_RESIST:
        case EFPROP_CONFLICT_RESIST:
        case EFPROP_CONFLICT_VULN:
          bVar6 = true;
          if (peVar13->reslevel_min <= (int)peVar16[peVar13->idx].res_level) {
            bVar6 = peVar13->reslevel_max < (int)peVar16[peVar13->idx].res_level;
          }
          break;
        case EFPROP_BRAND:
          if (p_Var2 == (_Bool *)0x0) {
LAB_00187ea6:
            bVar6 = true;
          }
          else {
            piVar15 = &brands[1].multiplier;
            iVar11 = 1;
            for (uVar14 = 1; uVar14 < z_info->brand_max; uVar14 = uVar14 + 1) {
              if (((p_Var2[uVar14] == true) && (piVar15[-2] == brands[peVar13->idx].resist_flag)) &&
                 (iVar11 < *piVar15)) {
                iVar11 = *piVar15;
              }
              piVar15 = piVar15 + 0xc;
            }
            bVar6 = brands[peVar13->idx].multiplier <= iVar11;
          }
          break;
        case EFPROP_SLAY:
          if (p_Var3 == (_Bool *)0x0) goto LAB_00187ea6;
          lVar8 = 100;
          iVar11 = 1;
          paVar10 = z_info;
          for (uVar14 = 1; uVar14 < paVar10->slay_max; uVar14 = uVar14 + 1) {
            if (((p_Var3[uVar14] == true) &&
                (_Var5 = same_monsters_slain((wchar_t)uVar14,peVar13->idx), paVar10 = z_info, _Var5)
                ) && (iVar1 = *(int *)((long)&slays->code + lVar8), iVar11 < iVar1)) {
              iVar11 = iVar1;
            }
            lVar8 = lVar8 + 0x38;
          }
          bVar6 = slays[peVar13->idx].multiplier <= iVar11;
        }
        peVar13 = peVar13->next;
      }
    }
    while (p != (effect_object_property *)0x0) {
      peVar13 = p->next;
      mem_free(p);
      p = peVar13;
    }
  }
  return;
}

Assistant:

static void final_check(struct artifact *art, struct object *obj)
{
	bitflag *flags = art ? art->flags : obj->flags;
	int16_t *modifiers = art ? art->modifiers : obj->modifiers;
	struct element_info *el_info = art ? art->el_info : obj->el_info;
	int i;

	/* Limit modifiers, remove sustains if a stat modifier is negative */
	for (i = 0; i < OBJ_MOD_MAX; i++) {
		if ((i < STAT_MAX) && (modifiers[i] < 0)) {
			of_off(flags, i + 1);
		}
		if (i != OBJ_MOD_SPEED) {
			modifiers[i] = MIN(modifiers[i], 6);
		}
	}

	/* Low resist means object is proof against that element */
	for (i = 0; i < ELEM_BASE_MAX; i++) {
		if (el_info[i].res_level < RES_LEVEL_BASE) {
			el_info[i].flags |= EL_INFO_IGNORE;
		}
	}

	/* Remove contradictory properties */
	if ((modifiers[OBJ_MOD_STEALTH] > 0) && of_has(flags, OF_AGGRAVATE)) {
		modifiers[OBJ_MOD_STEALTH] = 0;
	}
	if ((modifiers[OBJ_MOD_LIGHT] > 0) && of_has(flags, OF_DARKNESS)) {
		modifiers[OBJ_MOD_LIGHT] = 0;
	}
	remove_contradictory_activation(art, obj);
}